

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_file_scanfn(arg_file *parent,char *argval)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  byte *pbVar4;
  char *__s;
  uint uVar5;
  int iVar6;
  
  iVar1 = parent->count;
  if (iVar1 == (parent->hdr).maxcount) {
    return 2;
  }
  if (argval == (char *)0x0) goto LAB_00122e4d;
  parent->filename[iVar1] = argval;
  pcVar2 = strrchr(argval,0x2f);
  pbVar4 = (byte *)(pcVar2 + 1);
  if (pcVar2 == (char *)0x0) {
    pbVar4 = (byte *)argval;
  }
  if (*pbVar4 == 0x2e) {
    if (pbVar4[1] != 0) {
      uVar5 = pbVar4[1] - 0x2e;
      if (uVar5 == 0) {
        uVar5 = (uint)pbVar4[2];
      }
      iVar6 = -uVar5;
      goto LAB_00122dc5;
    }
LAB_00122dc9:
    sVar3 = strlen(argval);
    pbVar4 = (byte *)(argval + sVar3);
  }
  else {
    iVar6 = 0x2e - (uint)*pbVar4;
LAB_00122dc5:
    if (iVar6 == 0) goto LAB_00122dc9;
  }
  parent->basename[iVar1] = (char *)pbVar4;
  pcVar2 = parent->basename[iVar1];
  if (pcVar2 == (char *)0x0) {
LAB_00122e42:
    __s = (char *)0x0;
  }
  else {
    __s = strrchr(pcVar2,0x2e);
    if (__s == (char *)0x0) {
      sVar3 = strlen(pcVar2);
      __s = pcVar2 + sVar3;
    }
    if (__s == pcVar2) {
      sVar3 = strlen(pcVar2);
      __s = pcVar2 + sVar3;
    }
    if (__s == (char *)0x0) goto LAB_00122e42;
    sVar3 = strlen(__s);
    if (sVar3 == 1) {
      sVar3 = strlen(pcVar2);
      __s = pcVar2 + sVar3;
    }
  }
  parent->extension[iVar1] = __s;
LAB_00122e4d:
  parent->count = iVar1 + 1;
  return 0;
}

Assistant:

static int arg_file_scanfn(struct arg_file* parent, const char* argval) {
    int errorcode = 0;

    if (parent->count == parent->hdr.maxcount) {
        /* maximum number of arguments exceeded */
        errorcode = ARG_ERR_MAXCOUNT;
    } else if (!argval) {
        /* a valid argument with no argument value was given. */
        /* This happens when an optional argument value was invoked. */
        /* leave parent arguiment value unaltered but still count the argument. */
        parent->count++;
    } else {
        parent->filename[parent->count] = argval;
        parent->basename[parent->count] = arg_basename(argval);
        parent->extension[parent->count] =
                arg_extension(parent->basename[parent->count]); /* only seek extensions within the basename (not the file path)*/
        parent->count++;
    }

    ARG_TRACE(("%s4:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
    return errorcode;
}